

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

void __thiscall Mat::Resize(Mat *this,int newn)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  Mat ytemp;
  Mat local_28;
  
  Mat(&local_28,this);
  if (this->n_rows_ * this->n_cols_ != newn) {
    if (this->v_ != (double *)0x0) {
      operator_delete__(this->v_);
    }
    this->n_rows_ = newn;
    this->n_cols_ = 1;
    uVar3 = 0;
    if (newn < 1) {
      pdVar1 = (double *)0x0;
    }
    else {
      pdVar1 = (double *)operator_new__((ulong)(uint)newn << 3);
    }
    this->v_ = pdVar1;
    if (local_28.n_rows_ < newn) {
      newn = local_28.n_rows_;
    }
    uVar2 = (ulong)(uint)newn;
    if (newn < 1) {
      uVar2 = uVar3;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      pdVar1[uVar3] = local_28.v_[uVar3];
    }
  }
  ~Mat(&local_28);
  return;
}

Assistant:

void Mat::Resize(int newn)
{
	Mat ytemp = (*this);
	if (newn != n_cols_*n_rows_) {
		if (v_ != NULL)
			delete[] (v_);	
		n_rows_ = newn;
		n_cols_ = 1;
		v_ = n_rows_*n_cols_ > 0 ? new double[n_rows_] : NULL;		
		for ( int i = 0; i < min(n_rows_,ytemp.n_rows_); i++)
			v_[i] = ytemp.v_[i];
	}
}